

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrFutureCompletionBaseHeaderEXT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  code *pcVar1;
  void *value_00;
  XrWorldMeshStateRequestCompletionML *pXVar2;
  XrFutureCompletionBaseHeaderEXT *gen_dispatch_table_00;
  bool bVar3;
  XrInstance pXVar4;
  invalid_argument *this;
  __cxx11 local_248 [32];
  char acStack_228 [8];
  char futureResult_string [64];
  string futureresult_prefix;
  string local_1c8 [32];
  string local_1a8 [8];
  string next_prefix;
  __cxx11 local_188 [32];
  char acStack_168 [8];
  char type_string_1 [64];
  string local_120 [8];
  string type_prefix;
  XrFutureCompletionBaseHeaderEXT local_100;
  string local_e0 [32];
  string local_c0 [32];
  XrFutureCompletionBaseHeaderEXT *local_a0;
  XrWorldMeshRequestCompletionML *new_value_1;
  string local_68 [32];
  XrFutureCompletionBaseHeaderEXT *local_48;
  XrWorldMeshStateRequestCompletionML *new_value;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *contents_local;
  string *psStack_30;
  bool is_pointer_local;
  string *type_string_local;
  string *prefix_local;
  XrFutureCompletionBaseHeaderEXT *value_local;
  XrGeneratedDispatchTable *gen_dispatch_table_local;
  
  new_value = (XrWorldMeshStateRequestCompletionML *)contents;
  contents_local._7_1_ = is_pointer;
  psStack_30 = type_string;
  type_string_local = prefix;
  prefix_local = (string *)value;
  value_local = (XrFutureCompletionBaseHeaderEXT *)gen_dispatch_table;
  if (value->type == XR_TYPE_WORLD_MESH_STATE_REQUEST_COMPLETION_ML) {
    local_48 = value;
    std::__cxx11::string::string(local_68,(string *)prefix);
    std::__cxx11::string::string((string *)&new_value_1,(string *)type_string);
    gen_dispatch_table_local._7_1_ =
         ApiDumpOutputXrStruct
                   (gen_dispatch_table,(XrWorldMeshStateRequestCompletionML *)value,
                    (string *)local_68,(string *)&new_value_1,(bool)(contents_local._7_1_ & 1),
                    (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)new_value);
    std::__cxx11::string::~string((string *)&new_value_1);
    std::__cxx11::string::~string(local_68);
  }
  else if (value->type == XR_TYPE_WORLD_MESH_REQUEST_COMPLETION_ML) {
    local_a0 = value;
    std::__cxx11::string::string(local_c0,(string *)prefix);
    std::__cxx11::string::string(local_e0,(string *)type_string);
    gen_dispatch_table_local._7_1_ =
         ApiDumpOutputXrStruct
                   (gen_dispatch_table,(XrWorldMeshRequestCompletionML *)value,(string *)local_c0,
                    (string *)local_e0,(bool)(contents_local._7_1_ & 1),
                    (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)new_value);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_c0);
  }
  else {
    PointerToHexString<XrFutureCompletionBaseHeaderEXT>(&local_100);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,type_string,prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    if ((contents_local._7_1_ & 1) == 0) {
      std::__cxx11::string::operator+=((string *)prefix,".");
    }
    else {
      std::__cxx11::string::operator+=((string *)prefix,"->");
    }
    std::__cxx11::string::string(local_120,(string *)prefix);
    std::__cxx11::string::operator+=(local_120,"type");
    pXVar2 = new_value;
    if (value_local == (XrFutureCompletionBaseHeaderEXT *)0x0) {
      std::__cxx11::to_string(local_188,*(int *)prefix_local);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)pXVar2,(char (*) [16])"XrStructureType",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
      std::__cxx11::string::~string((string *)local_188);
    }
    else {
      type_string_1[0x28] = '\0';
      type_string_1[0x29] = '\0';
      type_string_1[0x2a] = '\0';
      type_string_1[0x2b] = '\0';
      type_string_1[0x2c] = '\0';
      type_string_1[0x2d] = '\0';
      type_string_1[0x2e] = '\0';
      type_string_1[0x2f] = '\0';
      type_string_1[0x30] = '\0';
      type_string_1[0x31] = '\0';
      type_string_1[0x32] = '\0';
      type_string_1[0x33] = '\0';
      type_string_1[0x34] = '\0';
      type_string_1[0x35] = '\0';
      type_string_1[0x36] = '\0';
      type_string_1[0x37] = '\0';
      type_string_1[0x18] = '\0';
      type_string_1[0x19] = '\0';
      type_string_1[0x1a] = '\0';
      type_string_1[0x1b] = '\0';
      type_string_1[0x1c] = '\0';
      type_string_1[0x1d] = '\0';
      type_string_1[0x1e] = '\0';
      type_string_1[0x1f] = '\0';
      type_string_1[0x20] = '\0';
      type_string_1[0x21] = '\0';
      type_string_1[0x22] = '\0';
      type_string_1[0x23] = '\0';
      type_string_1[0x24] = '\0';
      type_string_1[0x25] = '\0';
      type_string_1[0x26] = '\0';
      type_string_1[0x27] = '\0';
      type_string_1[8] = '\0';
      type_string_1[9] = '\0';
      type_string_1[10] = '\0';
      type_string_1[0xb] = '\0';
      type_string_1[0xc] = '\0';
      type_string_1[0xd] = '\0';
      type_string_1[0xe] = '\0';
      type_string_1[0xf] = '\0';
      type_string_1[0x10] = '\0';
      type_string_1[0x11] = '\0';
      type_string_1[0x12] = '\0';
      type_string_1[0x13] = '\0';
      type_string_1[0x14] = '\0';
      type_string_1[0x15] = '\0';
      type_string_1[0x16] = '\0';
      type_string_1[0x17] = '\0';
      acStack_168[0] = '\0';
      acStack_168[1] = '\0';
      acStack_168[2] = '\0';
      acStack_168[3] = '\0';
      acStack_168[4] = '\0';
      acStack_168[5] = '\0';
      acStack_168[6] = '\0';
      acStack_168[7] = '\0';
      type_string_1[0] = '\0';
      type_string_1[1] = '\0';
      type_string_1[2] = '\0';
      type_string_1[3] = '\0';
      type_string_1[4] = '\0';
      type_string_1[5] = '\0';
      type_string_1[6] = '\0';
      type_string_1[7] = '\0';
      pcVar1 = *(code **)&value_local[2].futureResult;
      pXVar4 = FindInstanceFromDispatchTable((XrGeneratedDispatchTable *)value_local);
      (*pcVar1)(pXVar4,*(undefined4 *)prefix_local,acStack_168);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)new_value,(char (*) [16])"XrStructureType",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                 (char (*) [64])acStack_168);
    }
    std::__cxx11::string::string(local_1a8,(string *)prefix);
    std::__cxx11::string::operator+=(local_1a8,"next");
    gen_dispatch_table_00 = value_local;
    value_00 = *(void **)(prefix_local + 8);
    std::__cxx11::string::string(local_1c8,local_1a8);
    bVar3 = ApiDumpDecodeNextChain
                      ((XrGeneratedDispatchTable *)gen_dispatch_table_00,value_00,
                       (string *)local_1c8,
                       (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)new_value);
    std::__cxx11::string::~string(local_1c8);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Invalid Operation");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::string::string((string *)(futureResult_string + 0x38),(string *)prefix);
    std::__cxx11::string::operator+=((string *)(futureResult_string + 0x38),"futureResult");
    pXVar2 = new_value;
    if (value_local == (XrFutureCompletionBaseHeaderEXT *)0x0) {
      std::__cxx11::to_string(local_248,*(int *)(prefix_local + 0x10));
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)pXVar2,(char (*) [9])"XrResult",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (futureResult_string + 0x38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
      std::__cxx11::string::~string((string *)local_248);
    }
    else {
      futureResult_string[0x28] = '\0';
      futureResult_string[0x29] = '\0';
      futureResult_string[0x2a] = '\0';
      futureResult_string[0x2b] = '\0';
      futureResult_string[0x2c] = '\0';
      futureResult_string[0x2d] = '\0';
      futureResult_string[0x2e] = '\0';
      futureResult_string[0x2f] = '\0';
      futureResult_string[0x30] = '\0';
      futureResult_string[0x31] = '\0';
      futureResult_string[0x32] = '\0';
      futureResult_string[0x33] = '\0';
      futureResult_string[0x34] = '\0';
      futureResult_string[0x35] = '\0';
      futureResult_string[0x36] = '\0';
      futureResult_string[0x37] = '\0';
      futureResult_string[0x18] = '\0';
      futureResult_string[0x19] = '\0';
      futureResult_string[0x1a] = '\0';
      futureResult_string[0x1b] = '\0';
      futureResult_string[0x1c] = '\0';
      futureResult_string[0x1d] = '\0';
      futureResult_string[0x1e] = '\0';
      futureResult_string[0x1f] = '\0';
      futureResult_string[0x20] = '\0';
      futureResult_string[0x21] = '\0';
      futureResult_string[0x22] = '\0';
      futureResult_string[0x23] = '\0';
      futureResult_string[0x24] = '\0';
      futureResult_string[0x25] = '\0';
      futureResult_string[0x26] = '\0';
      futureResult_string[0x27] = '\0';
      futureResult_string[8] = '\0';
      futureResult_string[9] = '\0';
      futureResult_string[10] = '\0';
      futureResult_string[0xb] = '\0';
      futureResult_string[0xc] = '\0';
      futureResult_string[0xd] = '\0';
      futureResult_string[0xe] = '\0';
      futureResult_string[0xf] = '\0';
      futureResult_string[0x10] = '\0';
      futureResult_string[0x11] = '\0';
      futureResult_string[0x12] = '\0';
      futureResult_string[0x13] = '\0';
      futureResult_string[0x14] = '\0';
      futureResult_string[0x15] = '\0';
      futureResult_string[0x16] = '\0';
      futureResult_string[0x17] = '\0';
      acStack_228[0] = '\0';
      acStack_228[1] = '\0';
      acStack_228[2] = '\0';
      acStack_228[3] = '\0';
      acStack_228[4] = '\0';
      acStack_228[5] = '\0';
      acStack_228[6] = '\0';
      acStack_228[7] = '\0';
      futureResult_string[0] = '\0';
      futureResult_string[1] = '\0';
      futureResult_string[2] = '\0';
      futureResult_string[3] = '\0';
      futureResult_string[4] = '\0';
      futureResult_string[5] = '\0';
      futureResult_string[6] = '\0';
      futureResult_string[7] = '\0';
      pcVar1 = (code *)value_local[2].next;
      pXVar4 = FindInstanceFromDispatchTable((XrGeneratedDispatchTable *)value_local);
      (*pcVar1)(pXVar4,*(undefined4 *)(prefix_local + 0x10),acStack_228);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,char(&)[64]>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)new_value,(char (*) [9])"XrResult",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (futureResult_string + 0x38),(char (*) [64])acStack_228);
    }
    gen_dispatch_table_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)(futureResult_string + 0x38));
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string(local_120);
  }
  return (bool)(gen_dispatch_table_local._7_1_ & 1);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrFutureCompletionBaseHeaderEXT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        if (value->type == XR_TYPE_WORLD_MESH_STATE_REQUEST_COMPLETION_ML) {
            const XrWorldMeshStateRequestCompletionML* new_value = reinterpret_cast<const XrWorldMeshStateRequestCompletionML*>(value);
            return ApiDumpOutputXrStruct(gen_dispatch_table, new_value, prefix, type_string, is_pointer, contents);
        }
        if (value->type == XR_TYPE_WORLD_MESH_REQUEST_COMPLETION_ML) {
            const XrWorldMeshRequestCompletionML* new_value = reinterpret_cast<const XrWorldMeshRequestCompletionML*>(value);
            return ApiDumpOutputXrStruct(gen_dispatch_table, new_value, prefix, type_string, is_pointer, contents);
        }
        // Fallback path - Just output generic information about the base struct
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string futureresult_prefix = prefix;
        futureresult_prefix += "futureResult";
        if (nullptr != gen_dispatch_table) {
            char futureResult_string[XR_MAX_RESULT_STRING_SIZE] = {};
            gen_dispatch_table->ResultToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                               value->futureResult, futureResult_string);
            contents.emplace_back("XrResult", futureresult_prefix, futureResult_string);
        } else {
                        contents.emplace_back("XrResult", futureresult_prefix, std::to_string(value->futureResult));
        }
        return true;
    } catch(...) {
    }
    return false;
}